

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  JSAMPLE JVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  JSAMPLE *pJVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar16 = 0; (int)lVar16 != 8; lVar16 = lVar16 + 1) {
    sVar6 = coef_block[lVar16 + 0x10];
    if (sVar6 == 0 && coef_block[lVar16 + 8] == 0) {
      if (((coef_block[lVar16 + 0x18] != 0) || (coef_block[lVar16 + 0x20] != 0)) ||
         ((coef_block[lVar16 + 0x28] != 0 ||
          ((coef_block[lVar16 + 0x30] != 0 || (coef_block[lVar16 + 0x38] != 0)))))) {
        sVar6 = 0;
        goto LAB_00109e6c;
      }
      iVar19 = (int)coef_block[lVar16] * *(int *)((long)pvVar4 + lVar16 * 4) * 4;
      aiStack_154[lVar16 + 7] = iVar19;
      aiStack_154[lVar16 + 0xf] = iVar19;
      aiStack_154[lVar16 + 0x17] = iVar19;
      aiStack_154[lVar16 + 0x1f] = iVar19;
      aiStack_154[lVar16 + 0x27] = iVar19;
      aiStack_154[lVar16 + 0x2f] = iVar19;
      aiStack_154[lVar16 + 0x37] = iVar19;
      lVar9 = 0xe0;
    }
    else {
LAB_00109e6c:
      lVar9 = (long)sVar6 * (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0x40);
      lVar25 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0xc0) * (long)coef_block[lVar16 + 0x30];
      lVar20 = (lVar25 + lVar9) * 0x1151;
      lVar10 = lVar9 * 0x187e + lVar20;
      lVar20 = lVar25 * -0x3b21 + lVar20;
      lVar9 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0x80) * (long)coef_block[lVar16 + 0x20];
      uVar26 = (long)*(int *)((long)pvVar4 + lVar16 * 4) * (long)coef_block[lVar16] * 0x2000;
      lVar21 = lVar9 * 0x2000 + uVar26 + 0x400;
      lVar27 = (uVar26 | 0x400) + lVar9 * -0x2000;
      lVar9 = lVar21 + lVar10;
      lVar21 = lVar21 - lVar10;
      lVar10 = lVar27 + lVar20;
      lVar27 = lVar27 - lVar20;
      lVar30 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0xe0) * (long)coef_block[lVar16 + 0x38];
      lVar11 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0xa0) * (long)coef_block[lVar16 + 0x28];
      lVar28 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0x60) * (long)coef_block[lVar16 + 0x18];
      lVar29 = (long)*(int *)((long)pvVar4 + lVar16 * 4 + 0x20) * (long)coef_block[lVar16 + 8];
      lVar20 = (lVar28 + lVar30 + lVar11 + lVar29) * 0x25a1;
      lVar14 = (lVar28 + lVar30) * -0x3ec5 + lVar20;
      lVar20 = (lVar11 + lVar29) * -0xc7c + lVar20;
      lVar25 = (lVar30 + lVar29) * -0x1ccd;
      lVar30 = lVar30 * 0x98e + lVar25 + lVar14;
      lVar29 = lVar29 * 0x300b + lVar25 + lVar20;
      lVar25 = (lVar28 + lVar11) * -0x5203;
      lVar20 = lVar11 * 0x41b3 + lVar25 + lVar20;
      lVar14 = lVar28 * 0x6254 + lVar25 + lVar14;
      aiStack_154[lVar16 + 7] = (int)((ulong)(lVar9 + lVar29) >> 0xb);
      aiStack_154[lVar16 + 0x3f] = (int)((ulong)(lVar9 - lVar29) >> 0xb);
      aiStack_154[lVar16 + 0xf] = (int)((ulong)(lVar14 + lVar10) >> 0xb);
      aiStack_154[lVar16 + 0x37] = (int)((ulong)(lVar10 - lVar14) >> 0xb);
      aiStack_154[lVar16 + 0x17] = (int)((ulong)(lVar20 + lVar27) >> 0xb);
      aiStack_154[lVar16 + 0x2f] = (int)((ulong)(lVar27 - lVar20) >> 0xb);
      aiStack_154[lVar16 + 0x1f] = (int)((ulong)(lVar30 + lVar21) >> 0xb);
      iVar19 = (int)((ulong)(lVar21 - lVar30) >> 0xb);
      lVar9 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar16 * 4 + lVar9 + 0x1c) = iVar19;
  }
  lVar16 = 7;
  do {
    if (lVar16 == 0x47) {
      return;
    }
    pJVar22 = (JSAMPLE *)(*(long *)((long)output_buf + lVar16 + -7) + (ulong)output_col);
    iVar19 = aiStack_154[lVar16 + 1];
    iVar23 = aiStack_154[lVar16 + 2];
    if (aiStack_154[lVar16 + 2] == 0 && iVar19 == 0) {
      iVar12 = 0;
      iVar23 = 0;
      if ((((aiStack_154[lVar16 + 3] != 0) || (aiStack_154[lVar16 + 4] != 0)) ||
          (iVar23 = iVar12, aiStack_154[lVar16 + 5] != 0)) ||
         ((aiStack_154[lVar16 + 6] != 0 || (aiStack_154[lVar16 + 7] != 0)))) goto LAB_0010a0ba;
      JVar5 = pJVar3[(ulong)(aiStack_154[lVar16] + 0x10U >> 5 & 0x3ff) + 0x80];
      auVar31 = pshuflw(ZEXT216(CONCAT11(JVar5,JVar5)),ZEXT216(CONCAT11(JVar5,JVar5)),0);
      *(int *)pJVar22 = auVar31._0_4_;
      pJVar22[4] = JVar5;
      pJVar22[5] = JVar5;
      pJVar22[6] = JVar5;
      lVar9 = 7;
    }
    else {
LAB_0010a0ba:
      iVar7 = (aiStack_154[lVar16 + 6] + iVar23) * 0x1151;
      iVar12 = iVar23 * 0x187e + iVar7;
      iVar7 = aiStack_154[lVar16 + 6] * -0x3b21 + iVar7;
      iVar1 = aiStack_154[lVar16 + 3];
      iVar24 = (aiStack_154[lVar16] + aiStack_154[lVar16 + 4] + 0x10) * 0x2000;
      iVar13 = ((aiStack_154[lVar16] + 0x10) - aiStack_154[lVar16 + 4]) * 0x2000;
      iVar23 = iVar24 + iVar12;
      iVar24 = iVar24 - iVar12;
      iVar12 = iVar13 + iVar7;
      iVar13 = iVar13 - iVar7;
      iVar7 = aiStack_154[lVar16 + 7];
      iVar2 = aiStack_154[lVar16 + 5];
      iVar17 = (iVar7 + iVar1 + iVar2 + iVar19) * 0x25a1;
      iVar8 = (iVar7 + iVar1) * -0x3ec5 + iVar17;
      iVar17 = (iVar2 + iVar19) * -0xc7c + iVar17;
      iVar15 = (iVar7 + iVar19) * -0x1ccd;
      iVar18 = iVar19 * 0x300b + iVar15 + iVar17;
      iVar19 = (iVar2 + iVar1) * -0x5203;
      iVar17 = iVar2 * 0x41b3 + iVar19 + iVar17;
      iVar7 = iVar7 * 0x98e + iVar15 + iVar8;
      iVar8 = iVar1 * 0x6254 + iVar19 + iVar8;
      *pJVar22 = pJVar3[(ulong)((uint)(iVar18 + iVar23) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[7] = pJVar3[(ulong)((uint)(iVar23 - iVar18) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[1] = pJVar3[(ulong)((uint)(iVar8 + iVar12) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[6] = pJVar3[(ulong)((uint)(iVar12 - iVar8) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[2] = pJVar3[(ulong)((uint)(iVar13 + iVar17) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[5] = pJVar3[(ulong)((uint)(iVar13 - iVar17) >> 0x12 & 0x3ff) + 0x80];
      pJVar22[3] = pJVar3[(ulong)((uint)(iVar7 + iVar24) >> 0x12 & 0x3ff) + 0x80];
      JVar5 = pJVar3[(ulong)((uint)(iVar24 - iVar7) >> 0x12 & 0x3ff) + 0x80];
      lVar9 = 4;
    }
    pJVar22[lVar9] = JVar5;
    lVar16 = lVar16 + 8;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_islow (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;

      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;

    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int) DESCALE((INT32) wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    /* Add fudge factor here for final descale. */
    z2 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z3 = (INT32) wsptr[4];

    tmp0 = (z2 + z3) << CONST_BITS;
    tmp1 = (z2 - z3) << CONST_BITS;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (INT32) wsptr[7];
    tmp1 = (INT32) wsptr[5];
    tmp2 = (INT32) wsptr[3];
    tmp3 = (INT32) wsptr[1];

    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}